

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O3

int __thiscall
QHttpNetworkConnectionPrivate::init(QHttpNetworkConnectionPrivate *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  QHttpNetworkConnectionChannel *pQVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&this->field_0x8;
  if (0 < this->channelCount) {
    pQVar2 = this->channels;
    lVar4 = 0;
    lVar3 = 0;
    do {
      QHttpNetworkConnectionChannel::setConnection
                ((QHttpNetworkConnectionChannel *)(&pQVar2->super_QObject + lVar4),
                 *(QHttpNetworkConnection **)&this->field_0x8);
      pQVar2 = this->channels;
      (&pQVar2->ssl)[lVar4] = this->encrypt;
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x108;
    } while (lVar3 < this->channelCount);
  }
  QTimer::setSingleShot(SUB81(&this->delayedConnectionTimer,0));
  QObject::connect(local_30,(char *)&this->delayedConnectionTimer,(QObject *)"2timeout()",pcVar1,
                   0x268cc0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::init()
{
    Q_Q(QHttpNetworkConnection);
    for (int i = 0; i < channelCount; i++) {
        channels[i].setConnection(this->q_func());
        channels[i].ssl = encrypt;
    }

    delayedConnectionTimer.setSingleShot(true);
    QObject::connect(&delayedConnectionTimer, SIGNAL(timeout()), q, SLOT(_q_connectDelayedChannel()));
}